

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

QPDFObjectHandle __thiscall QPDF::getRoot(QPDF *this)

{
  pointer pcVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  bool bVar3;
  bool bVar4;
  string *psVar5;
  QPDFExc *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  QPDF *in_RSI;
  QPDFObjectHandle QVar7;
  string local_140;
  string local_120;
  QPDFObjectHandle local_100;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [128];
  
  _Var2._M_head_impl =
       (in_RSI->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
       _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  pcVar1 = local_b0 + 0x10;
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"/Root","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)&(_Var2._M_head_impl)->trailer);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)this);
  if (bVar3) {
    bVar3 = ((in_RSI->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->check_mode;
    if (bVar3 == true) {
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"/Type","");
      QPDFObjectHandle::getKey(&local_100,(string *)this);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/Catalog","");
      bVar4 = QPDFObjectHandle::isNameAndEquals(&local_100,&local_d0);
      bVar4 = !bVar4;
      _Var6._M_pi = extraout_RDX_00;
    }
    else {
      bVar4 = false;
      _Var6._M_pi = extraout_RDX;
    }
    if (bVar3 != false) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        _Var6._M_pi = extraout_RDX_01;
      }
      if (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_100.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        _Var6._M_pi = extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        _Var6._M_pi = extraout_RDX_03;
      }
    }
    if (bVar4) {
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"catalog /Type entry missing or invalid","");
      psVar5 = (string *)
               (**(code **)(**(long **)&(((in_RSI->m)._M_t.
                                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                          .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                         _M_head_impl)->file).
                                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                           + 0x18))();
      QPDFExc::QPDFExc((QPDFExc *)local_b0,qpdf_e_damaged_pdf,psVar5,&local_120,-1,&local_f0,true);
      warn(in_RSI,(QPDFExc *)local_b0);
      QPDFExc::~QPDFExc((QPDFExc *)local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      local_b0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"/Type","");
      operator____qpdf((char *)&local_120,0x262c97);
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)this,(string *)local_b0,(QPDFObjectHandle *)&local_120);
      _Var6._M_pi = extraout_RDX_04;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_string_length);
        _Var6._M_pi = extraout_RDX_05;
      }
      if ((pointer)local_b0._0_8_ != pcVar1) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        _Var6._M_pi = extraout_RDX_06;
      }
    }
    QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var6._M_pi;
    QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (QPDFObjectHandle)
           QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,"unable to find /Root dictionary","");
  psVar5 = (string *)
           (**(code **)(**(long **)&(((in_RSI->m)._M_t.
                                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                      .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                    file).
                                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                       0x18))();
  QPDFExc::QPDFExc(this_00,qpdf_e_damaged_pdf,psVar5,(string *)local_b0,-1,&local_140,true);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

QPDFObjectHandle
QPDF::getRoot()
{
    QPDFObjectHandle root = m->trailer.getKey("/Root");
    if (!root.isDictionary()) {
        throw damagedPDF("", -1, "unable to find /Root dictionary");
    } else if (
        // Check_mode is an interim solution to request #810 pending a more comprehensive review of
        // the approach to more extensive checks and warning levels.
        m->check_mode && !root.getKey("/Type").isNameAndEquals("/Catalog")) {
        warn(damagedPDF("", -1, "catalog /Type entry missing or invalid"));
        root.replaceKey("/Type", "/Catalog"_qpdf);
    }
    return root;
}